

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_alloc.c
# Opt level: O2

int main(void)

{
  int iVar1;
  time_t tVar2;
  void *pvVar3;
  void *pvVar4;
  size_t real_size;
  char *pcVar5;
  undefined8 uVar6;
  int i;
  long lVar7;
  float actual_alloc_factor;
  undefined1 local_70 [8];
  slab_arena arena1;
  quota quota1;
  float actual_alloc_factor_1;
  
  plan(4);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n","main");
  tVar2 = time((time_t *)0x0);
  seed = (uint)tVar2;
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"random seed is %u",(ulong)seed);
  fputc(10,_stdout);
  srand(seed);
  quota.value = 0x40000000000000;
  slab_arena_create(&arena,&quota,0,4000000,2);
  slab_cache_create(&cache,&arena);
  plan(1);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n","small_alloc_basic");
  small_alloc_test(0xc,5000,1000,0x400,5000);
  _ok(1,"true",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_alloc.c",0x75,
      "line %d",0x75);
  _space((FILE *)_stdout);
  printf("# *** %s: done ***\n","small_alloc_basic");
  check_plan();
  plan(1);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n","small_alloc_large");
  small_alloc_test((cache.arena)->slab_size - 0x70 >> 4 & 0xfffffff8,(cache.arena)->slab_size * 2,
                   0x32,10,100);
  _ok(1,"true",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_alloc.c",0x86,
      "line %d",0x86);
  _space((FILE *)_stdout);
  printf("# *** %s: done ***\n","small_alloc_large");
  check_plan();
  plan(1);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n","test_small_alloc_info");
  real_size = 0x40;
  small_alloc_create(&alloc,&cache,0x40,0x40,1.5,(float *)&stack0xfffffffffffffd38);
  check_small_alloc_info((small_alloc *)0x101,0,false,real_size);
  check_small_alloc_info((small_alloc *)0x200,0,false,real_size);
  check_small_alloc_info((small_alloc *)0x4001,0,false,real_size);
  check_small_alloc_info((small_alloc *)0x40000,0,false,real_size);
  check_small_alloc_info((small_alloc *)0x40001,1,true,real_size);
  _ok(1,"true",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_alloc.c",0xb5,
      "line %d",0xb5);
  small_alloc_destroy(&alloc);
  _space((FILE *)_stdout);
  printf("# *** %s: done ***\n","test_small_alloc_info");
  check_plan();
  plan(1);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n","small_alloc_low_alloc_factor");
  arena1.slab_size = 0;
  arena1.flags = 0x400;
  slab_arena_create((slab_arena *)local_70,(quota *)&arena1.slab_size,0,4000000,2);
  slab_cache_create((slab_cache *)&stack0xfffffffffffffd38,(slab_arena *)local_70);
  small_alloc_create(&alloc,(slab_cache *)&stack0xfffffffffffffd38,0xc,8,1.001,
                     (float *)((long)&quota1.value + 4));
  if (alloc.small_mempool_cache_size == 0x400) {
    if (alloc.objsize_max < 0x400) {
      pcVar5 = "alloc_size <= alloc.objsize_max";
      uVar6 = 0xd9;
    }
    else {
      pvVar3 = calloc(0x400,8);
      if (pvVar3 != (void *)0x0) {
        for (lVar7 = 0; lVar7 != 0x400; lVar7 = lVar7 + 1) {
          pvVar4 = smalloc(&alloc,0x400);
          if (pvVar4 == (void *)0x0) break;
          *(void **)((long)pvVar3 + lVar7 * 8) = pvVar4;
        }
        for (lVar7 = 0;
            (lVar7 != 0x400 &&
            (pvVar4 = *(void **)((long)pvVar3 + lVar7 * 8), pvVar4 != (void *)0x0));
            lVar7 = lVar7 + 1) {
          smfree(&alloc,pvVar4,0x400);
        }
        small_alloc_destroy(&alloc);
        slab_cache_destroy((slab_cache *)&stack0xfffffffffffffd38);
        slab_arena_destroy((slab_arena *)local_70);
        _ok(1,"true",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_alloc.c"
            ,0xee,"line %d",0xee);
        _space((FILE *)_stdout);
        printf("# *** %s: done ***\n","small_alloc_low_alloc_factor");
        check_plan();
        slab_cache_destroy(&cache);
        _space((FILE *)_stdout);
        printf("# *** %s: done ***\n","main");
        iVar1 = check_plan();
        return iVar1;
      }
      pcVar5 = "allocations != NULL";
      uVar6 = 0xdc;
    }
  }
  else {
    pcVar5 = "alloc.small_mempool_cache_size == SMALL_MEMPOOL_MAX";
    uVar6 = 0xd7;
  }
  fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",pcVar5,"false",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_alloc.c",
          uVar6,"small_alloc_low_alloc_factor");
  exit(-1);
}

Assistant:

int main()
{
#ifdef ENABLE_ASAN
	plan(3);
#else
	plan(4);
#endif
	header();

	seed = time(NULL);
	note("random seed is %u", seed);
	srand(seed);

	quota_init(&quota, UINT_MAX);
	slab_arena_create(&arena, &quota, 0, 4000000,
			  MAP_PRIVATE);
	slab_cache_create(&cache, &arena);

	small_alloc_basic();
#ifndef ENABLE_ASAN
	small_alloc_large();
	test_small_alloc_info();
	small_alloc_low_alloc_factor();
#else
	small_wrong_size_in_free();
	small_membership();
#endif

	slab_cache_destroy(&cache);

	footer();
	return check_plan();
}